

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void DC16_SSE2(uint8_t *dst)

{
  int iVar1;
  long lVar2;
  undefined1 auVar3 [16];
  
  iVar1 = 0;
  for (lVar2 = -1; lVar2 != 0x1ff; lVar2 = lVar2 + 0x20) {
    iVar1 = iVar1 + (uint)dst[lVar2];
  }
  auVar3 = psadbw(*(undefined1 (*) [16])(dst + -0x20),(undefined1  [16])0x0);
  Put16_SSE2((uint8_t)(iVar1 + (uint)(ushort)(auVar3._8_2_ + auVar3._0_2_) + 0x10 >> 5),dst);
  return;
}

Assistant:

static void DC16_SSE2(uint8_t* dst) {  // DC
  const __m128i zero = _mm_setzero_si128();
  const __m128i top = _mm_loadu_si128((const __m128i*)(dst - BPS));
  const __m128i sad8x2 = _mm_sad_epu8(top, zero);
  // sum the two sads: sad8x2[0:1] + sad8x2[8:9]
  const __m128i sum = _mm_add_epi16(sad8x2, _mm_shuffle_epi32(sad8x2, 2));
  int left = 0;
  int j;
  for (j = 0; j < 16; ++j) {
    left += dst[-1 + j * BPS];
  }
  {
    const int DC = _mm_cvtsi128_si32(sum) + left + 16;
    Put16_SSE2(DC >> 5, dst);
  }
}